

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void load256i128(uint16_t *out,secp256k1_int128 *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar2 = *(undefined8 *)((long)v + 8);
  uVar1 = (undefined8)*v;
  auVar4._0_4_ = (int)(short)uVar1;
  auVar4._4_4_ = (int)(short)((ulong)uVar1 >> 0x10);
  auVar4._8_4_ = (int)(short)((ulong)uVar1 >> 0x20);
  auVar4._12_4_ = (int)(short)((ulong)uVar1 >> 0x30);
  auVar5._0_4_ = (int)(short)uVar2;
  auVar5._4_4_ = (int)(short)((ulong)uVar2 >> 0x10);
  auVar5._8_4_ = (int)(short)((ulong)uVar2 >> 0x20);
  auVar5._12_4_ = (int)(short)((ulong)uVar2 >> 0x30);
  auVar4 = packssdw(auVar4,auVar5);
  *(undefined1 (*) [16])out = auVar4;
  auVar4 = ZEXT416((uint)((long)uVar2 >> 0x3f));
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar3 = auVar4._0_4_;
  *(undefined4 *)(out + 8) = uVar3;
  *(undefined4 *)(out + 10) = uVar3;
  *(undefined4 *)(out + 0xc) = uVar3;
  *(undefined4 *)(out + 0xe) = uVar3;
  return;
}

Assistant:

static void load256i128(uint16_t* out, const secp256k1_int128* v) {
    uint64_t lo;
    int64_t hi;
    secp256k1_int128 c = *v;
    lo = secp256k1_i128_to_u64(&c);
    secp256k1_i128_rshift(&c, 64);
    hi = secp256k1_i128_to_i64(&c);
    load256two64(out, hi, lo, 1);
}